

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

bool slang::syntax::PatternSyntax::isKind(SyntaxKind kind)

{
  if ((int)kind < 0x1c9) {
    if (((kind != ExpressionPattern) && (kind != ParenthesizedPattern)) &&
       (kind != StructurePattern)) {
      return false;
    }
  }
  else if (((kind != TaggedPattern) && (kind != VariablePattern)) && (kind != WildcardPattern)) {
    return false;
  }
  return true;
}

Assistant:

bool PatternSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::ExpressionPattern:
        case SyntaxKind::ParenthesizedPattern:
        case SyntaxKind::StructurePattern:
        case SyntaxKind::TaggedPattern:
        case SyntaxKind::VariablePattern:
        case SyntaxKind::WildcardPattern:
            return true;
        default:
            return false;
    }
}